

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::NetParameter::NetParameter(NetParameter *this,NetParameter *from)

{
  int new_size;
  void *pvVar1;
  string *initial_value;
  bool bVar2;
  NetState *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__NetParameter_0071c540;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->layers_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->layers_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->layers_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->layers_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase,&(from->layers_).super_RepeatedPtrFieldBase
            );
  (this->input_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->input_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->input_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->input_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->input_).super_RepeatedPtrFieldBase,&(from->input_).super_RepeatedPtrFieldBase);
  (this->input_dim_).current_size_ = 0;
  (this->input_dim_).total_size_ = 0;
  (this->input_dim_).rep_ = (Rep *)0x0;
  new_size = (from->input_dim_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<int>::Reserve(&this->input_dim_,new_size);
    memcpy(((this->input_dim_).rep_)->elements,((from->input_dim_).rep_)->elements,
           (long)(from->input_dim_).current_size_ << 2);
    (this->input_dim_).current_size_ = (from->input_dim_).current_size_;
  }
  (this->input_shape_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->input_shape_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->input_shape_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->input_shape_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
            (&(this->input_shape_).super_RepeatedPtrFieldBase,
             &(from->input_shape_).super_RepeatedPtrFieldBase);
  (this->layer_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->layer_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->layer_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->layer_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
            (&(this->layer_).super_RepeatedPtrFieldBase,&(from->layer_).super_RepeatedPtrFieldBase);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (initial_value = (from->name_).ptr_,
     initial_value != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_))
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,initial_value);
  }
  if (((from->_has_bits_).has_bits_[0] & 2) == 0) {
    this_00 = (NetState *)0x0;
  }
  else {
    this_00 = (NetState *)operator_new(0x38);
    NetState::NetState(this_00,from->state_);
  }
  this->state_ = this_00;
  bVar2 = from->debug_info_;
  this->force_backward_ = from->force_backward_;
  this->debug_info_ = bVar2;
  return;
}

Assistant:

NetParameter::NetParameter(const NetParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      layers_(from.layers_),
      input_(from.input_),
      input_dim_(from.input_dim_),
      input_shape_(from.input_shape_),
      layer_(from.layer_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.has_state()) {
    state_ = new ::caffe::NetState(*from.state_);
  } else {
    state_ = NULL;
  }
  ::memcpy(&force_backward_, &from.force_backward_,
    reinterpret_cast<char*>(&debug_info_) -
    reinterpret_cast<char*>(&force_backward_) + sizeof(debug_info_));
  // @@protoc_insertion_point(copy_constructor:caffe.NetParameter)
}